

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetTenor
          (FXBase *this,string *tenor_key,string *settlement_key,Tenor *tenor)

{
  FX *pFVar1;
  __type _Var2;
  bool bVar3;
  Tenor *pTVar4;
  ostream *poVar5;
  InvalidSubjectException *pIVar6;
  string near_tenor;
  string local_1d0;
  stringstream ss;
  ostream local_1a0 [376];
  
  Tenor::ToString_abi_cxx11_((string *)&ss,tenor);
  Tenor::ToString_abi_cxx11_(&near_tenor,(Tenor *)Tenor::BROKEN_DATE);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                          &near_tenor);
  if (_Var2) {
    bVar3 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       settlement_key);
    std::__cxx11::string::~string((string *)&near_tenor);
    std::__cxx11::string::~string((string *)&ss);
    if (!bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->outer_class_->super_MandatoryFieldsSubjectCreator).mandatory_keys_,
                  settlement_key);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&near_tenor);
    std::__cxx11::string::~string((string *)&ss);
  }
  _Var2 = std::operator==(tenor_key,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          SubjectKey::FAR_TENOR_abi_cxx11_);
  if (_Var2) {
    bVar3 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       (string *)SubjectKey::TENOR_abi_cxx11_);
    if (!bVar3) goto LAB_001be630;
    SubjectBuilder::GetComponent
              (&near_tenor,
               &(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
               (string *)SubjectKey::TENOR_abi_cxx11_);
    pTVar4 = Tenor::GetTenorFromString(&near_tenor);
    bVar3 = Tenor::IsValidNearFarTenor(pTVar4,tenor);
    if (!bVar3) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = std::operator<<(local_1a0,"Invalid near/far tenor combination: [TENOR] ");
      poVar5 = std::operator<<(poVar5,(string *)&near_tenor);
      poVar5 = std::operator<<(poVar5," [FAR] ");
      Tenor::ToString_abi_cxx11_(&local_1d0,tenor);
      std::operator<<(poVar5,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      pIVar6 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      InvalidSubjectException::InvalidSubjectException(pIVar6,&local_1d0);
      __cxa_throw(pIVar6,&InvalidSubjectException::typeinfo,
                  InvalidSubjectException::~InvalidSubjectException);
    }
  }
  else {
    _Var2 = std::operator==(tenor_key,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            SubjectKey::TENOR_abi_cxx11_);
    if (!_Var2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = std::operator<<(local_1a0,"Invalid tenor key: ");
      std::operator<<(poVar5,(string *)tenor_key);
      pIVar6 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      InvalidSubjectException::InvalidSubjectException(pIVar6,&near_tenor);
      __cxa_throw(pIVar6,&InvalidSubjectException::typeinfo,
                  InvalidSubjectException::~InvalidSubjectException);
    }
    bVar3 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       (string *)SubjectKey::FAR_TENOR_abi_cxx11_);
    if (!bVar3) goto LAB_001be630;
    SubjectBuilder::GetComponent
              (&near_tenor,
               &(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
               (string *)SubjectKey::FAR_TENOR_abi_cxx11_);
    pTVar4 = Tenor::GetTenorFromString(&near_tenor);
    bVar3 = Tenor::IsValidNearFarTenor(tenor,pTVar4);
    if (!bVar3) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = std::operator<<(local_1a0,"Invalid near/far tenor combination: [TENOR] ");
      Tenor::ToString_abi_cxx11_(&local_1d0,tenor);
      poVar5 = std::operator<<(poVar5,(string *)&local_1d0);
      poVar5 = std::operator<<(poVar5," [FAR] ");
      std::operator<<(poVar5,(string *)&near_tenor);
      std::__cxx11::string::~string((string *)&local_1d0);
      pIVar6 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      InvalidSubjectException::InvalidSubjectException(pIVar6,&local_1d0);
      __cxa_throw(pIVar6,&InvalidSubjectException::typeinfo,
                  InvalidSubjectException::~InvalidSubjectException);
    }
  }
  std::__cxx11::string::~string((string *)&near_tenor);
LAB_001be630:
  pFVar1 = this->outer_class_;
  Tenor::ToString_abi_cxx11_((string *)&ss,tenor);
  SubjectBuilder::SetComponent
            (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,tenor_key,(string *)&ss
            );
  std::__cxx11::string::~string((string *)&ss);
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::SetTenor(const std::string& tenor_key, const std::string& settlement_key, const Tenor& tenor)
{
    if (tenor.ToString() == Tenor::BROKEN_DATE.ToString() && !outer_class_.subject_builder_.ContainsKey(settlement_key))
    {
        outer_class_.AddMandatoryKey(settlement_key);
    }

    if (tenor_key == SubjectKey::FAR_TENOR)
    {
        if (outer_class_.subject_builder_.ContainsKey(SubjectKey::TENOR))
        {
            std::string near_tenor = outer_class_.subject_builder_.GetComponent(SubjectKey::TENOR);

            if (!Tenor::IsValidNearFarTenor(Tenor::GetTenorFromString(near_tenor), tenor))
            {
                std::stringstream ss;
                ss << "Invalid near/far tenor combination: [TENOR] " <<  near_tenor << " [FAR] " << tenor.ToString();
                throw InvalidSubjectException(ss.str());
            }
        }
    }
    else if (tenor_key == SubjectKey::TENOR)
    {
        if (outer_class_.subject_builder_.ContainsKey(SubjectKey::FAR_TENOR))
        {
            std::string far_tenor = outer_class_.subject_builder_.GetComponent(SubjectKey::FAR_TENOR);

            if (!Tenor::IsValidNearFarTenor(tenor, Tenor::GetTenorFromString(far_tenor)))
            {
                std::stringstream ss;
                ss << "Invalid near/far tenor combination: [TENOR] " <<  tenor.ToString() << " [FAR] " << far_tenor;
                throw InvalidSubjectException(ss.str());
            }
        }
    }
    else
    {
        std::stringstream ss;
        ss << "Invalid tenor key: " <<  tenor_key;
        throw InvalidSubjectException(ss.str());
    }

    outer_class_.subject_builder_.SetComponent(tenor_key, tenor.ToString());
}